

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O2

Data * Data::bigger(vector<Data_*,_std::allocator<Data_*>_> *dataPara)

{
  pointer ppDVar1;
  Data *pDVar2;
  long lVar3;
  long lVar4;
  vector<Data_*,_std::allocator<Data_*>_> *__range1;
  iterator __begin1;
  pointer ppDVar5;
  Data *pDVar6;
  
  ppDVar5 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar3 = __dynamic_cast(*ppDVar5,&typeinfo,&Integer::typeinfo,0);
  lVar3 = *(long *)(lVar3 + 0x10);
  lVar4 = __dynamic_cast(ppDVar5[1],&typeinfo,&Integer::typeinfo,0);
  pDVar6 = falseData;
  pDVar2 = trueData;
  lVar4 = *(long *)(lVar4 + 0x10);
  ppDVar1 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (; ppDVar5 != ppDVar1; ppDVar5 = ppDVar5 + 1) {
    check(*ppDVar5);
  }
  if (lVar4 < lVar3) {
    pDVar6 = pDVar2;
  }
  std::_Vector_base<Data_*,_std::allocator<Data_*>_>::~_Vector_base
            (&dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>);
  operator_delete(dataPara);
  return pDVar6;
}

Assistant:

Data *Data::bigger(std::vector<Data *> *dataPara) {
    Data *result = NULL;
    if ((dynamic_cast<Integer *>((*dataPara)[0]))->value
        > (dynamic_cast<Integer *>((*dataPara)[1]))->value) {
        result = Data::trueData;
    } else {
        result = Data::falseData;
    }
    for (auto i: *dataPara) {
        Data::check(i);
    }
    delete dataPara;
    return result;
}